

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unescape.cc
# Opt level: O0

uint32_t re2c::unesc_oct(char *s,char *s_end)

{
  uint32_t local_1c;
  uint32_t n;
  char *s_end_local;
  char *s_local;
  
  local_1c = 0;
  for (s_end_local = s + 1; s_end_local != s_end; s_end_local = s_end_local + 1) {
    local_1c = ((int)*s_end_local - 0x30U & 0xff) + local_1c * 8;
  }
  return local_1c;
}

Assistant:

uint32_t unesc_oct (const char * s, const char * s_end)
{
	uint32_t n = 0;
	for (++s; s != s_end; ++s)
	{
		n <<= 3;
		n += static_cast<uint8_t> (*s - '0');
	}
	return n;
}